

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O1

int __thiscall Event::listen(Event *this,int __fd,int __n)

{
  code *pcVar1;
  undefined4 in_register_00000014;
  undefined8 *puVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  _Any_data local_88;
  code *local_78;
  undefined8 local_70;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  puVar2 = (undefined8 *)CONCAT44(in_register_00000014,__n);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  local_70 = puVar2[3];
  pcVar1 = (code *)puVar2[2];
  if (pcVar1 != (code *)0x0) {
    local_88._M_unused._0_8_ = (undefined8)*puVar2;
    local_88._8_8_ = puVar2[1];
    puVar2[2] = 0;
    puVar2[3] = 0;
    local_78 = pcVar1;
  }
  std::function<void_()>::function((function<void_()> *)&local_68,(function<void_()> *)&local_88);
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  std::vector<Callable,_std::allocator<Callable>_>::emplace_back<Callable>
            ((vector<Callable,_std::allocator<Callable>_> *)(puVar3 + 5),(Callable *)&local_68);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  this->m_eventRegister = (EventRegister *)*puVar3;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->m_name,puVar3[1],puVar3[2] + puVar3[1])
  ;
  std::vector<Callable,_std::allocator<Callable>_>::vector
            (&this->m_listeners,(vector<Callable,_std::allocator<Callable>_> *)(puVar3 + 5));
  return (int)this;
}

Assistant:

Event Event::listen(std::function<void()> func)
{
    m_listeners.emplace_back(Callable(std::move(func)));
    return *this;
}